

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O0

void Sat_MemRollBack(Sat_Mem_t *p)

{
  int *piVar1;
  int iVar2;
  Sat_Mem_t *p_local;
  
  p->nEntries[0] = p->BookMarkE[0];
  p->nEntries[1] = p->BookMarkE[1];
  iVar2 = Sat_MemHandPage(p,p->BookMarkH[0]);
  p->iPage[0] = iVar2;
  iVar2 = Sat_MemHandPage(p,p->BookMarkH[1]);
  p->iPage[1] = iVar2;
  piVar1 = p->pPages[p->iPage[0]];
  iVar2 = Sat_MemHandShift(p,p->BookMarkH[0]);
  Sat_MemWriteLimit(piVar1,iVar2);
  piVar1 = p->pPages[p->iPage[1]];
  iVar2 = Sat_MemHandShift(p,p->BookMarkH[1]);
  Sat_MemWriteLimit(piVar1,iVar2);
  return;
}

Assistant:

static inline void Sat_MemRollBack( Sat_Mem_t * p )
{
    p->nEntries[0]  = p->BookMarkE[0];
    p->nEntries[1]  = p->BookMarkE[1];
    p->iPage[0]     = Sat_MemHandPage( p, p->BookMarkH[0] );
    p->iPage[1]     = Sat_MemHandPage( p, p->BookMarkH[1] );
    Sat_MemWriteLimit( p->pPages[p->iPage[0]], Sat_MemHandShift( p, p->BookMarkH[0] ) );
    Sat_MemWriteLimit( p->pPages[p->iPage[1]], Sat_MemHandShift( p, p->BookMarkH[1] ) );
}